

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O0

void cvui::internal::image(cvui_block_t *theBlock,int theX,int theY,Mat *theImage)

{
  Size_<int> local_40;
  Size_<int> local_38;
  Size aSize;
  Rect aRect;
  Mat *theImage_local;
  int theY_local;
  int theX_local;
  cvui_block_t *theBlock_local;
  
  cv::Rect_<int>::Rect_
            ((Rect_<int> *)&aSize,theX,theY,*(int *)(theImage + 0xc),*(int *)(theImage + 8));
  render::image(theBlock,(Rect *)&aSize,theImage);
  cv::Size_<int>::Size_(&local_38,*(int *)(theImage + 0xc),*(int *)(theImage + 8));
  cv::Size_<int>::Size_(&local_40,&local_38);
  updateLayoutFlow(theBlock,&local_40);
  return;
}

Assistant:

void image(cvui_block_t& theBlock, int theX, int theY, cv::Mat& theImage) {
		cv::Rect aRect(theX, theY, theImage.cols, theImage.rows);

		// TODO: check for render outside the frame area
		render::image(theBlock, aRect, theImage);

		// Update the layout flow according to image size
		cv::Size aSize(theImage.cols, theImage.rows);
		updateLayoutFlow(theBlock, aSize);
	}